

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptor::CopyTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  long lVar1;
  Type *proto_00;
  Type *proto_01;
  Type *proto_02;
  Type *proto_03;
  FileOptions *pFVar2;
  FileOptions *pFVar3;
  int i_3;
  long lVar4;
  int i;
  long lVar5;
  
  FileDescriptorProto::set_name(proto,*(string **)this);
  if ((*(string **)(this + 8))->_M_string_length != 0) {
    FileDescriptorProto::set_package(proto,*(string **)(this + 8));
  }
  for (lVar5 = 0; lVar5 < *(int *)(this + 0x18); lVar5 = lVar5 + 1) {
    FileDescriptorProto::add_dependency
              (proto,(string *)**(undefined8 **)(*(long *)(this + 0x20) + lVar5 * 8));
  }
  for (lVar5 = 0; lVar5 < *(int *)(this + 0x28); lVar5 = lVar5 + 1) {
    FileDescriptorProto::add_public_dependency(proto,*(int32 *)(*(long *)(this + 0x30) + lVar5 * 4))
    ;
  }
  for (lVar5 = 0; lVar5 < *(int *)(this + 0x38); lVar5 = lVar5 + 1) {
    FileDescriptorProto::add_weak_dependency(proto,*(int32 *)(*(long *)(this + 0x40) + lVar5 * 4));
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(this + 0x48); lVar5 = lVar5 + 1) {
    lVar1 = *(long *)(this + 0x50);
    proto_00 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(proto->message_type_).super_RepeatedPtrFieldBase);
    Descriptor::CopyTo((Descriptor *)(lVar1 + lVar4),proto_00);
    lVar4 = lVar4 + 0x78;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(this + 0x58); lVar5 = lVar5 + 1) {
    lVar1 = *(long *)(this + 0x60);
    proto_01 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(proto->enum_type_).super_RepeatedPtrFieldBase);
    EnumDescriptor::CopyTo((EnumDescriptor *)(lVar1 + lVar4),proto_01);
    lVar4 = lVar4 + 0x38;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(this + 0x68); lVar5 = lVar5 + 1) {
    lVar1 = *(long *)(this + 0x70);
    proto_02 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                         (&(proto->service_).super_RepeatedPtrFieldBase);
    ServiceDescriptor::CopyTo((ServiceDescriptor *)(lVar1 + lVar4),proto_02);
    lVar4 = lVar4 + 0x30;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(this + 0x78); lVar5 = lVar5 + 1) {
    lVar1 = *(long *)(this + 0x80);
    proto_03 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(proto->extension_).super_RepeatedPtrFieldBase);
    FieldDescriptor::CopyTo((FieldDescriptor *)(lVar1 + lVar4),proto_03);
    lVar4 = lVar4 + 0x78;
  }
  pFVar3 = *(FileOptions **)(this + 0x88);
  pFVar2 = FileOptions::default_instance();
  if (pFVar3 != pFVar2) {
    pFVar3 = FileDescriptorProto::mutable_options(proto);
    FileOptions::CopyFrom(pFVar3,*(FileOptions **)(this + 0x88));
    return;
  }
  return;
}

Assistant:

void FileDescriptor::CopyTo(FileDescriptorProto* proto) const {
  proto->set_name(name());
  if (!package().empty()) proto->set_package(package());

  for (int i = 0; i < dependency_count(); i++) {
    proto->add_dependency(dependency(i)->name());
  }

  for (int i = 0; i < public_dependency_count(); i++) {
    proto->add_public_dependency(public_dependencies_[i]);
  }

  for (int i = 0; i < weak_dependency_count(); i++) {
    proto->add_weak_dependency(weak_dependencies_[i]);
  }

  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyTo(proto->add_message_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < service_count(); i++) {
    service(i)->CopyTo(proto->add_service());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }

  if (&options() != &FileOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}